

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O2

mg_value * mg_map_at(mg_map *map,char *key_str)

{
  size_t sVar1;
  mg_value *pmVar2;
  
  sVar1 = strlen(key_str);
  if (0xfffffffe < sVar1) {
    return (mg_value *)0x0;
  }
  pmVar2 = mg_map_at2(map,(uint32_t)sVar1,key_str);
  return pmVar2;
}

Assistant:

const mg_value *mg_map_at(const mg_map *map, const char *key_str) {
  size_t key_size = strlen(key_str);
  if (key_size >= UINT32_MAX) {
    return NULL;
  }
  return mg_map_at2(map, (uint32_t)key_size, key_str);
}